

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

QString * Utils::exec(QString *__return_storage_ptr__,QString *cmd)

{
  FILE *__stream;
  char *pcVar1;
  storage_type *psVar2;
  runtime_error *this;
  QByteArrayView QVar3;
  char buffer [256];
  QArrayData *local_140 [3];
  QArrayData *local_128;
  char *local_120;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QString::toLocal8Bit_helper((QChar *)&local_128,(longlong)(cmd->d).ptr);
  if (local_120 == (char *)0x0) {
    local_120 = (char *)&QByteArray::_empty;
  }
  __stream = popen(local_120,"r");
  if (local_128 != (QArrayData *)0x0) {
    LOCK();
    (local_128->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_128->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_128->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_128,1,8);
    }
  }
  if (__stream != (FILE *)0x0) {
    pcVar1 = fgets((char *)&local_128,0x100,__stream);
    if (pcVar1 != (char *)0x0) {
      do {
        psVar2 = (storage_type *)strlen((char *)&local_128);
        QVar3.m_data = psVar2;
        QVar3.m_size = (qsizetype)local_140;
        QString::fromUtf8(QVar3);
        QString::append((QString *)__return_storage_ptr__);
        if (local_140[0] != (QArrayData *)0x0) {
          LOCK();
          (local_140[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_140[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_140[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_140[0],2,8);
          }
        }
        pcVar1 = fgets((char *)&local_128,0x100,__stream);
      } while (pcVar1 != (char *)0x0);
    }
    pclose(__stream);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"popen() failed!");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

QString exec(const QString &cmd) {
    QString result;
    FILE* pipe = popen(cmd.toLocal8Bit().constData(), "r");

    if (!pipe)
        throw runtime_error("popen() failed!");

    try {
        char buffer[BUFFER_SIZE];

        while (fgets(buffer, sizeof(buffer), pipe) != nullptr) {
            result += buffer;
        }
    } catch (...) {
        pclose(pipe);
        throw;
    }

    pclose(pipe);

    return result;
}